

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000182000 = 0x2e2e2e2e2e2e2e;
    uRam0000000000182007._0_1_ = '.';
    uRam0000000000182007._1_1_ = '.';
    uRam0000000000182007._2_1_ = '.';
    uRam0000000000182007._3_1_ = '.';
    uRam0000000000182007._4_1_ = '.';
    uRam0000000000182007._5_1_ = '.';
    uRam0000000000182007._6_1_ = '.';
    uRam0000000000182007._7_1_ = '.';
    DAT_00181ff0 = '.';
    DAT_00181ff0_1._0_1_ = '.';
    DAT_00181ff0_1._1_1_ = '.';
    DAT_00181ff0_1._2_1_ = '.';
    DAT_00181ff0_1._3_1_ = '.';
    DAT_00181ff0_1._4_1_ = '.';
    DAT_00181ff0_1._5_1_ = '.';
    DAT_00181ff0_1._6_1_ = '.';
    uRam0000000000181ff8 = 0x2e2e2e2e2e2e2e;
    DAT_00181fff = 0x2e;
    DAT_00181fe0 = '.';
    DAT_00181fe0_1._0_1_ = '.';
    DAT_00181fe0_1._1_1_ = '.';
    DAT_00181fe0_1._2_1_ = '.';
    DAT_00181fe0_1._3_1_ = '.';
    DAT_00181fe0_1._4_1_ = '.';
    DAT_00181fe0_1._5_1_ = '.';
    DAT_00181fe0_1._6_1_ = '.';
    uRam0000000000181fe8._0_1_ = '.';
    uRam0000000000181fe8._1_1_ = '.';
    uRam0000000000181fe8._2_1_ = '.';
    uRam0000000000181fe8._3_1_ = '.';
    uRam0000000000181fe8._4_1_ = '.';
    uRam0000000000181fe8._5_1_ = '.';
    uRam0000000000181fe8._6_1_ = '.';
    uRam0000000000181fe8._7_1_ = '.';
    DAT_00181fd0 = '.';
    DAT_00181fd0_1._0_1_ = '.';
    DAT_00181fd0_1._1_1_ = '.';
    DAT_00181fd0_1._2_1_ = '.';
    DAT_00181fd0_1._3_1_ = '.';
    DAT_00181fd0_1._4_1_ = '.';
    DAT_00181fd0_1._5_1_ = '.';
    DAT_00181fd0_1._6_1_ = '.';
    uRam0000000000181fd8._0_1_ = '.';
    uRam0000000000181fd8._1_1_ = '.';
    uRam0000000000181fd8._2_1_ = '.';
    uRam0000000000181fd8._3_1_ = '.';
    uRam0000000000181fd8._4_1_ = '.';
    uRam0000000000181fd8._5_1_ = '.';
    uRam0000000000181fd8._6_1_ = '.';
    uRam0000000000181fd8._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam0000000000181fc8._0_1_ = '.';
    uRam0000000000181fc8._1_1_ = '.';
    uRam0000000000181fc8._2_1_ = '.';
    uRam0000000000181fc8._3_1_ = '.';
    uRam0000000000181fc8._4_1_ = '.';
    uRam0000000000181fc8._5_1_ = '.';
    uRam0000000000181fc8._6_1_ = '.';
    uRam0000000000181fc8._7_1_ = '.';
    DAT_0018200f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}